

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalSlot.h
# Opt level: O2

void __thiscall
Signal<std::function<void(std::shared_ptr<SocketClient>const&,String_const&,unsigned_short,Buffer&&)>>
::operator()(Signal<std::function<void(std::shared_ptr<SocketClient>const&,String_const&,unsigned_short,Buffer&&)>>
             *this,shared_ptr<SocketClient> *args,String *args_1,unsigned_short *args_2,
            Buffer *args_3)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  map<unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>_>_>
  conn;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(this + 8))->__data);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>_>_>
  ::operator=(&local_60,
              (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>_>_>
               *)(this + 0x30));
  pthread_mutex_unlock((pthread_mutex_t *)(this + 8));
  for (p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var1; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::
    function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>
    ::operator()((function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>
                  *)&p_Var2[1]._M_parent,args,args_1,*args_2,args_3);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::function<void_(const_std::shared_ptr<SocketClient>_&,_const_String_&,_unsigned_short,_Buffer_&&)>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void operator()(Args&&... args)
    {
        std::map<Key, Signature> conn;
        {
            std::lock_guard<std::mutex> locker(mutex);
            conn = connections;
        }
        for (auto& connection : conn) {
            connection.second(std::forward<Args>(args)...);
        }
    }